

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilisticSampler.h
# Opt level: O0

void __thiscall
jaegertracing::samplers::ProbabilisticSampler::ProbabilisticSampler
          (ProbabilisticSampler *this,double samplingRate)

{
  initializer_list<jaegertracing::Tag> __l;
  double *pdVar1;
  uint64_t uVar2;
  Tag *local_190;
  allocator<jaegertracing::Tag> local_12b;
  undefined1 local_12a;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  Tag *local_e0;
  Tag local_d8;
  Tag local_90;
  iterator local_48;
  size_type local_40;
  double local_28;
  undefined1 local_20 [16];
  double samplingRate_local;
  ProbabilisticSampler *this_local;
  
  local_20._8_8_ = samplingRate;
  samplingRate_local = (double)this;
  Sampler::Sampler(&this->super_Sampler);
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_005157f0;
  local_20._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_28 = 1.0;
  pdVar1 = std::min<double>((double *)(local_20 + 8),&local_28);
  pdVar1 = std::max<double>((double *)local_20,pdVar1);
  this->_samplingRate = *pdVar1;
  uVar2 = computeSamplingBoundary((longdouble)this->_samplingRate);
  this->_samplingBoundary = uVar2;
  local_12a = 1;
  local_e0 = &local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"sampler.type",&local_101);
  Tag::Tag<char_const*const&>(&local_d8,&local_100,&kSamplerTypeProbabilistic);
  local_e0 = &local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"sampler.param",&local_129);
  Tag::Tag<double&>(&local_90,&local_128,&this->_samplingRate);
  local_12a = 0;
  local_48 = &local_d8;
  local_40 = 2;
  std::allocator<jaegertracing::Tag>::allocator(&local_12b);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,&local_12b);
  std::allocator<jaegertracing::Tag>::~allocator(&local_12b);
  local_190 = (Tag *)&local_48;
  do {
    local_190 = local_190 + -1;
    Tag::~Tag(local_190);
  } while (local_190 != &local_d8);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  return;
}

Assistant:

explicit ProbabilisticSampler(double samplingRate)
        : _samplingRate(std::max(0.0, std::min(samplingRate, 1.0)))
        , _samplingBoundary(computeSamplingBoundary(_samplingRate))
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeProbabilistic },
                  { kSamplerParamTagKey, _samplingRate } })
    {
    }